

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O2

int VP8EncWrite(VP8Encoder *enc)

{
  VP8BitWriter *bw_00;
  VP8EncProba *probas;
  int *percent_store;
  long lVar1;
  undefined2 uVar2;
  WebPPicture *pic;
  WebPAuxStats *pWVar3;
  WebPPicture *pWVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  WebPEncodingError WVar8;
  int iVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  ulong uVar13;
  ulong uVar14;
  size_t *psVar15;
  long lVar16;
  WebPPicture *pWVar17;
  VP8BitWriter *bw;
  VP8BitWriter *bw_01;
  uint32_t uVar18;
  bool bVar19;
  byte local_68 [8];
  undefined2 uStack_60;
  undefined2 uStack_5e;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 local_58;
  undefined1 local_57;
  int local_4c;
  size_t local_48;
  uint8_t *local_40;
  ulong local_38;
  
  pic = enc->pic;
  bw_00 = &enc->bw;
  local_4c = (int)(0x13 / (long)enc->num_parts);
  iVar6 = enc->percent;
  iVar5 = enc->mb_w;
  iVar9 = enc->mb_h;
  uVar10 = VP8BitWriterPos(bw_00);
  iVar5 = VP8BitWriterInit(bw_00,(long)((iVar5 * iVar9 * 7) / 8));
  if (iVar5 == 0) {
    pWVar17 = enc->pic;
LAB_00130811:
    iVar5 = WebPEncodingSetError(pWVar17,VP8_ENC_ERROR_OUT_OF_MEMORY);
    if (iVar5 == 0) {
      return 0;
    }
  }
  else {
    VP8PutBitUniform(bw_00,0);
    VP8PutBitUniform(bw_00,0);
    probas = &enc->proba;
    iVar5 = VP8PutBitUniform(bw_00,(uint)(1 < (enc->segment_hdr).num_segments));
    if (iVar5 != 0) {
      VP8PutBitUniform(bw_00,(enc->segment_hdr).update_map);
      iVar5 = VP8PutBitUniform(bw_00,1);
      if (iVar5 != 0) {
        VP8PutBitUniform(bw_00,1);
        for (lVar16 = 0; lVar16 != 0xba0; lVar16 = lVar16 + 0x2e8) {
          VP8PutSignedBits(bw_00,*(int *)((long)&enc->dqm[0].quant + lVar16),7);
        }
        for (lVar16 = 0; lVar16 != 0xba0; lVar16 = lVar16 + 0x2e8) {
          VP8PutSignedBits(bw_00,*(int *)((long)&enc->dqm[0].fstrength + lVar16),6);
        }
      }
      if ((enc->segment_hdr).update_map != 0) {
        for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
          iVar5 = VP8PutBitUniform(bw_00,(uint)(probas->segments[lVar16] != 0xff));
          if (iVar5 != 0) {
            VP8PutBits(bw_00,(uint)probas->segments[lVar16],8);
          }
        }
      }
    }
    iVar5 = (enc->filter_hdr).i4x4_lf_delta;
    VP8PutBitUniform(bw_00,(enc->filter_hdr).simple);
    VP8PutBits(bw_00,(enc->filter_hdr).level,6);
    uVar18 = 3;
    VP8PutBits(bw_00,(enc->filter_hdr).sharpness,3);
    iVar5 = VP8PutBitUniform(bw_00,(uint)(iVar5 != 0));
    if ((iVar5 != 0) &&
       (iVar5 = VP8PutBitUniform(bw_00,(uint)((enc->filter_hdr).i4x4_lf_delta != 0)), iVar5 != 0)) {
      VP8PutBits(bw_00,0,4);
      VP8PutSignedBits(bw_00,(enc->filter_hdr).i4x4_lf_delta,6);
      VP8PutBits(bw_00,0,3);
    }
    iVar5 = enc->num_parts;
    if (iVar5 == 4) {
      uVar18 = 2;
    }
    else if (iVar5 != 8) {
      uVar18 = (uint32_t)(iVar5 == 2);
    }
    VP8PutBits(bw_00,uVar18,2);
    VP8PutBits(bw_00,enc->base_quant,7);
    VP8PutSignedBits(bw_00,enc->dq_y1_dc,4);
    VP8PutSignedBits(bw_00,enc->dq_y2_dc,4);
    VP8PutSignedBits(bw_00,enc->dq_y2_ac,4);
    VP8PutSignedBits(bw_00,enc->dq_uv_dc,4);
    VP8PutSignedBits(bw_00,enc->dq_uv_ac,4);
    VP8PutBitUniform(bw_00,0);
    VP8WriteProbas(bw_00,probas);
    uVar11 = VP8BitWriterPos(bw_00);
    VP8CodeIntraModes(enc);
    VP8BitWriterFinish(bw_00);
    pWVar17 = enc->pic;
    pWVar3 = pWVar17->stats;
    if (pWVar3 != (WebPAuxStats *)0x0) {
      uVar12 = VP8BitWriterPos(bw_00);
      pWVar3->header_bytes[0] = (int)((uVar11 - uVar10) + 7 >> 3);
      pWVar3->header_bytes[1] = (int)((uVar12 - uVar11) + 7 >> 3);
      pWVar3->alpha_data_size = enc->alpha_data_size;
    }
    if ((enc->bw).error != 0) goto LAB_00130811;
  }
  percent_store = &enc->percent;
  local_48 = (enc->bw).pos;
  uVar7 = enc->num_parts;
  lVar16 = local_48 + (long)(int)(uVar7 * 3 + -3) + 10;
  bw_01 = enc->parts;
  uVar13 = 0;
  uVar14 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar14 = uVar13;
  }
  for (; uVar14 * 0x30 - uVar13 != 0; uVar13 = uVar13 + 0x30) {
    lVar16 = lVar16 + *(long *)((long)&enc->parts[0].pos + uVar13);
  }
  uVar14 = (ulong)((uint)lVar16 & 1);
  bVar19 = enc->has_alpha == 0;
  lVar1 = uVar14 + 0x1e;
  if (bVar19) {
    lVar1 = uVar14 + 0xc;
  }
  uVar13 = lVar1 + lVar16;
  if (!bVar19) {
    uVar13 = uVar13 + (enc->alpha_data_size + (enc->alpha_data_size & 1) + 8);
  }
  if (0xfffffffe < uVar13) {
    iVar6 = WebPEncodingSetError(pic,VP8_ENC_ERROR_FILE_TOO_BIG);
    return iVar6;
  }
  pWVar17 = enc->pic;
  local_40 = (enc->bw).buf;
  local_68[0] = 0x52;
  local_68[1] = 0x49;
  local_68[2] = 0x46;
  local_68[3] = 0x46;
  uStack_60 = 0x4557;
  uStack_5e = 0x5042;
  local_68[4] = (byte)uVar13;
  local_68[5] = (byte)(uVar13 >> 8);
  local_68[6] = (byte)(uVar13 >> 0x10);
  local_68[7] = (byte)(uVar13 >> 0x18);
  iVar5 = (*pWVar17->writer)(local_68,0xc,pWVar17);
  local_38 = uVar13;
  if (iVar5 == 0) {
LAB_00130a76:
    WVar8 = VP8_ENC_ERROR_BAD_WRITE;
LAB_00130a7e:
    iVar5 = WebPEncodingSetError(pWVar17,WVar8);
    if (iVar5 != 0) goto LAB_00130a8a;
  }
  else {
    if (enc->has_alpha != 0) {
      pWVar4 = enc->pic;
      local_68[0] = 0x56;
      local_68[1] = 0x50;
      local_68[2] = 0x38;
      local_68[3] = 0x58;
      local_68[4] = 10;
      local_68[5] = 0;
      local_68[6] = 0;
      local_68[7] = 0;
      uStack_60 = 0x10;
      uStack_5e = 0;
      iVar5 = pWVar4->width + -1;
      uStack_5c = (undefined1)iVar5;
      uStack_5b = (undefined1)((uint)iVar5 >> 8);
      uStack_5a = (undefined1)((uint)iVar5 >> 0x10);
      iVar5 = pWVar4->height + -1;
      uStack_59 = (undefined1)iVar5;
      local_58 = (undefined1)((uint)iVar5 >> 8);
      local_57 = (undefined1)((uint)iVar5 >> 0x10);
      iVar5 = (*pWVar4->writer)(local_68,0x12,pWVar4);
      if (iVar5 == 0) goto LAB_00130a76;
      if (enc->has_alpha != 0) {
        pWVar4 = enc->pic;
        local_68[0] = 0x41;
        local_68[1] = 0x4c;
        local_68[2] = 0x50;
        local_68[3] = 0x48;
        uVar18 = enc->alpha_data_size;
        local_68[4] = (byte)uVar18;
        local_68[5] = (byte)(uVar18 >> 8);
        local_68[6] = (byte)(uVar18 >> 0x10);
        local_68[7] = (byte)(uVar18 >> 0x18);
        iVar5 = (*pWVar4->writer)(local_68,8,pWVar4);
        if (((iVar5 == 0) ||
            (iVar5 = (*pWVar4->writer)(enc->alpha_data,(ulong)enc->alpha_data_size,pWVar4),
            iVar5 == 0)) ||
           (((enc->alpha_data_size & 1) != 0 && (iVar5 = PutPaddingByte(pWVar4), iVar5 == 0))))
        goto LAB_00130a76;
      }
    }
    lVar16 = lVar16 + uVar14;
    local_68[0] = 0x56;
    local_68[1] = 0x50;
    local_68[2] = 0x38;
    local_68[3] = 0x20;
    local_68[4] = (byte)lVar16;
    local_68[5] = (byte)((ulong)lVar16 >> 8);
    local_68[6] = (byte)((ulong)lVar16 >> 0x10);
    local_68[7] = (byte)((ulong)lVar16 >> 0x18);
    iVar5 = (*pWVar17->writer)(local_68,8,pWVar17);
    WVar8 = VP8_ENC_ERROR_BAD_WRITE;
    if ((iVar5 == 0) || (WVar8 = VP8_ENC_ERROR_PARTITION0_OVERFLOW, 0x7ffff < local_48))
    goto LAB_00130a7e;
    uVar7 = (int)local_48 << 5 | enc->profile * 2;
    local_68[0] = (byte)uVar7 | 0x10;
    local_68[1] = (byte)(uVar7 >> 8);
    local_68[2] = (byte)(uVar7 >> 0x10);
    local_68[3] = 0x9d;
    local_68[4] = 1;
    local_68[5] = 0x2a;
    uVar2 = (undefined2)pWVar17->width;
    local_68[6] = (byte)uVar2;
    local_68[7] = (byte)((ushort)uVar2 >> 8);
    uStack_60 = (undefined2)pWVar17->height;
    iVar5 = (*pWVar17->writer)(local_68,10,pWVar17);
    if (iVar5 == 0) {
      WVar8 = VP8_ENC_ERROR_BAD_WRITE;
      goto LAB_00130a7e;
    }
LAB_00130a8a:
    iVar5 = (*pic->writer)(local_40,local_48,pic);
    if (iVar5 != 0) {
      iVar9 = 1;
      iVar5 = enc->num_parts;
      if (enc->num_parts < 2) {
        iVar5 = iVar9;
      }
      uVar7 = iVar5 - 1;
      psVar15 = &enc->parts[0].pos;
      for (lVar16 = 0; (ulong)uVar7 * 3 != lVar16; lVar16 = lVar16 + 3) {
        uVar13 = *psVar15;
        if (0xffffff < uVar13) {
          WVar8 = VP8_ENC_ERROR_PARTITION_OVERFLOW;
          goto LAB_00130b0c;
        }
        local_68[lVar16] = (byte)uVar13;
        local_68[lVar16 + 1] = (byte)(uVar13 >> 8);
        local_68[lVar16 + 2] = (byte)(uVar13 >> 0x10);
        psVar15 = psVar15 + 6;
      }
      if (uVar7 != 0) {
        iVar5 = (*pic->writer)(local_68,(ulong)(uVar7 * 3),pic);
        iVar9 = 1;
        if (iVar5 == 0) {
          WVar8 = VP8_ENC_ERROR_BAD_WRITE;
LAB_00130b0c:
          iVar9 = WebPEncodingSetError(pic,WVar8);
        }
      }
      uVar7 = (uint)(iVar9 != 0);
      goto LAB_00130b22;
    }
  }
  uVar7 = 0;
LAB_00130b22:
  VP8BitWriterWipeOut(bw_00);
  for (lVar16 = 0; lVar16 < enc->num_parts; lVar16 = lVar16 + 1) {
    if (bw_01->pos != 0) {
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        iVar5 = (*pic->writer)(bw_01->buf,bw_01->pos,pic);
        uVar7 = (uint)(iVar5 != 0);
      }
    }
    VP8BitWriterWipeOut(bw_01);
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      iVar5 = WebPReportProgress(pic,*percent_store + local_4c,percent_store);
      uVar7 = (uint)(iVar5 != 0);
    }
    bw_01 = bw_01 + 1;
  }
  if ((uVar7 != 0) && (uVar14 != 0)) {
    uVar7 = PutPaddingByte(pic);
  }
  enc->coded_size = (int)local_38 + 8;
  if ((uVar7 != 0) && (iVar6 = WebPReportProgress(pic,iVar6 + 0x13,percent_store), iVar6 != 0)) {
    return 1;
  }
  WebPEncodingSetError(pic,VP8_ENC_ERROR_BAD_WRITE);
  return 0;
}

Assistant:

int VP8EncWrite(VP8Encoder* const enc) {
  WebPPicture* const pic = enc->pic;
  VP8BitWriter* const bw = &enc->bw;
  const int task_percent = 19;
  const int percent_per_part = task_percent / enc->num_parts;
  const int final_percent = enc->percent + task_percent;
  int ok = 0;
  size_t vp8_size, pad, riff_size;
  int p;

  // Partition #0 with header and partition sizes
  ok = GeneratePartition0(enc);
  if (!ok) return 0;

  // Compute VP8 size
  vp8_size = VP8_FRAME_HEADER_SIZE +
             VP8BitWriterSize(bw) +
             3 * (enc->num_parts - 1);
  for (p = 0; p < enc->num_parts; ++p) {
    vp8_size += VP8BitWriterSize(enc->parts + p);
  }
  pad = vp8_size & 1;
  vp8_size += pad;

  // Compute RIFF size
  // At the minimum it is: "WEBPVP8 nnnn" + VP8 data size.
  riff_size = TAG_SIZE + CHUNK_HEADER_SIZE + vp8_size;
  if (IsVP8XNeeded(enc)) {  // Add size for: VP8X header + data.
    riff_size += CHUNK_HEADER_SIZE + VP8X_CHUNK_SIZE;
  }
  if (enc->has_alpha) {  // Add size for: ALPH header + data.
    const uint32_t padded_alpha_size = enc->alpha_data_size +
                                       (enc->alpha_data_size & 1);
    riff_size += CHUNK_HEADER_SIZE + padded_alpha_size;
  }
  // RIFF size should fit in 32-bits.
  if (riff_size > 0xfffffffeU) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_FILE_TOO_BIG);
  }

  // Emit headers and partition #0
  {
    const uint8_t* const part0 = VP8BitWriterBuf(bw);
    const size_t size0 = VP8BitWriterSize(bw);
    ok = ok && PutWebPHeaders(enc, size0, vp8_size, riff_size)
            && pic->writer(part0, size0, pic)
            && EmitPartitionsSize(enc, pic);
    VP8BitWriterWipeOut(bw);    // will free the internal buffer.
  }

  // Token partitions
  for (p = 0; p < enc->num_parts; ++p) {
    const uint8_t* const buf = VP8BitWriterBuf(enc->parts + p);
    const size_t size = VP8BitWriterSize(enc->parts + p);
    if (size) ok = ok && pic->writer(buf, size, pic);
    VP8BitWriterWipeOut(enc->parts + p);    // will free the internal buffer.
    ok = ok && WebPReportProgress(pic, enc->percent + percent_per_part,
                                  &enc->percent);
  }

  // Padding byte
  if (ok && pad) {
    ok = PutPaddingByte(pic);
  }

  enc->coded_size = (int)(CHUNK_HEADER_SIZE + riff_size);
  ok = ok && WebPReportProgress(pic, final_percent, &enc->percent);
  if (!ok) WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_WRITE);
  return ok;
}